

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int json_emit_va(char *s,int s_len,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  void *__src;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  int *piVar6;
  size_t sVar7;
  uint uVar8;
  size_t __n;
  char *pcVar9;
  long lVar10;
  byte *pbVar11;
  int iVar12;
  byte *s_00;
  char tmp [20];
  int local_58;
  char local_48 [24];
  
  pbVar11 = (byte *)(s + s_len);
  s_00 = (byte *)s;
  do {
    bVar1 = *fmt;
    iVar12 = (int)s_00;
    iVar2 = (int)pbVar11;
    if (bVar1 < 0x53) {
      uVar8 = bVar1 - 9;
      if (uVar8 < 0x3e) {
        if ((0x2000800800013U >> ((ulong)uVar8 & 0x3f) & 1) != 0) goto switchD_00106c77_caseD_5b;
        if ((ulong)uVar8 != 0x3d) goto LAB_00106cc4;
        uVar8 = iVar2 - iVar12;
        lVar10 = 5;
        if (0 < (int)uVar8) {
          sVar7 = 5;
          if ((int)uVar8 < 5) {
            sVar7 = (size_t)uVar8;
          }
          memcpy(s_00,"false",sVar7);
          if (5 < (int)uVar8) goto LAB_00106d4f;
        }
      }
      else {
LAB_00106cc4:
        if (bVar1 != 0x4e) {
          if (bVar1 == 0) {
            if (s_00 < pbVar11) {
              *s_00 = 0;
            }
            local_58 = (int)s;
            return iVar12 - local_58;
          }
LAB_00106f98:
          return 0;
        }
        uVar8 = iVar2 - iVar12;
        lVar10 = 4;
        if (0 < (int)uVar8) {
          sVar7 = 4;
          if ((int)uVar8 < 4) {
            sVar7 = (size_t)uVar8;
          }
          pcVar9 = "null";
          goto LAB_00106d3e;
        }
      }
    }
    else if (bVar1 < 0x66) {
      switch(bVar1) {
      case 0x53:
        uVar8 = ap->gp_offset;
        if ((ulong)uVar8 < 0x29) {
          puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar8 + 8;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
        }
        pcVar9 = (char *)*puVar4;
        uVar8 = iVar2 - iVar12;
        sVar7 = strlen(pcVar9);
        iVar2 = (int)sVar7;
        if ((0 < (int)uVar8) && (0 < iVar2)) {
          __n = (size_t)uVar8;
          if (iVar2 < (int)uVar8) {
            __n = sVar7 & 0xffffffff;
          }
          memcpy(s_00,pcVar9,__n);
          if (iVar2 < (int)uVar8) {
            s_00[__n] = 0;
          }
        }
        lVar10 = (long)iVar2;
        break;
      case 0x54:
        uVar8 = iVar2 - iVar12;
        lVar10 = 4;
        if (0 < (int)uVar8) {
          sVar7 = 4;
          if ((int)uVar8 < 4) {
            sVar7 = (size_t)uVar8;
          }
          pcVar9 = "true";
LAB_00106d3e:
          lVar10 = 4;
          memcpy(s_00,pcVar9,sVar7);
          if (4 < (int)uVar8) {
LAB_00106d4f:
            s_00[sVar7] = 0;
          }
        }
        break;
      default:
        goto LAB_00106f98;
      case 0x56:
        uVar8 = ap->gp_offset;
        if ((ulong)uVar8 < 0x29) {
          puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar8 + 8;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
        }
        __src = (void *)*puVar4;
        uVar8 = ap->gp_offset;
        if ((ulong)uVar8 < 0x29) {
          puVar5 = (ulong *)((ulong)uVar8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar8 + 8;
        }
        else {
          puVar5 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar5 + 1;
        }
        uVar8 = iVar2 - iVar12;
        iVar2 = (int)*puVar5;
        if ((0 < (int)uVar8) && (0 < iVar2)) {
          sVar7 = (size_t)uVar8;
          if (iVar2 < (int)uVar8) {
            sVar7 = *puVar5 & 0xffffffff;
          }
          memcpy(s_00,__src,sVar7);
          if (iVar2 < (int)uVar8) {
            s_00[sVar7] = 0;
          }
        }
        lVar10 = (long)iVar2;
        break;
      case 0x5b:
      case 0x5d:
switchD_00106c77_caseD_5b:
        lVar10 = 1;
        if (s_00 < pbVar11) {
          *s_00 = bVar1;
        }
      }
    }
    else if (bVar1 < 0x76) {
      if (bVar1 == 0x66) {
        uVar8 = ap->fp_offset;
        if ((ulong)uVar8 < 0xa1) {
          puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
          ap->fp_offset = uVar8 + 0x10;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
        }
        iVar3 = snprintf(local_48,0x14,"%g",*puVar4);
      }
      else {
        if (bVar1 != 0x69) {
          if (bVar1 != 0x73) {
            return 0;
          }
          uVar8 = ap->gp_offset;
          if ((ulong)uVar8 < 0x29) {
            puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
            ap->gp_offset = uVar8 + 8;
          }
          else {
            puVar4 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar4 + 1;
          }
          pcVar9 = (char *)*puVar4;
          sVar7 = strlen(pcVar9);
          iVar2 = json_emit_quoted_str((char *)s_00,iVar2 - iVar12,pcVar9,(int)sVar7);
          lVar10 = (long)iVar2;
          goto LAB_00106f76;
        }
        uVar8 = ap->gp_offset;
        if ((ulong)uVar8 < 0x29) {
          puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
          ap->gp_offset = uVar8 + 8;
        }
        else {
          puVar4 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar4 + 1;
        }
        iVar3 = snprintf(local_48,0x14,"%ld",*puVar4);
      }
      uVar8 = iVar2 - iVar12;
      if (iVar2 - iVar12 < 1) {
        uVar8 = 0;
      }
      strncpy((char *)s_00,local_48,(ulong)uVar8);
      lVar10 = (long)iVar3;
    }
    else {
      if (bVar1 != 0x76) {
        if ((bVar1 != 0x7d) && (bVar1 != 0x7b)) {
          return 0;
        }
        goto switchD_00106c77_caseD_5b;
      }
      uVar8 = ap->gp_offset;
      if ((ulong)uVar8 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar8 + (long)ap->reg_save_area);
        ap->gp_offset = uVar8 + 8;
      }
      else {
        puVar4 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar4 + 1;
      }
      pcVar9 = (char *)*puVar4;
      uVar8 = ap->gp_offset;
      if ((ulong)uVar8 < 0x29) {
        piVar6 = (int *)((ulong)uVar8 + (long)ap->reg_save_area);
        ap->gp_offset = uVar8 + 8;
      }
      else {
        piVar6 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar6 + 2;
      }
      iVar2 = json_emit_quoted_str((char *)s_00,iVar2 - iVar12,pcVar9,*piVar6);
      lVar10 = (long)iVar2;
    }
LAB_00106f76:
    s_00 = s_00 + lVar10;
    fmt = (char *)((byte *)fmt + 1);
  } while( true );
}

Assistant:

int json_emit_va(char *s, int s_len, const char *fmt, va_list ap) {
    const char *end = s + s_len, *str, *orig = s;
    size_t len;

    while (*fmt != '\0') {
        switch (*fmt) {
            case '[':
            case ']':
            case '{':
            case '}':
            case ',':
            case ':':
            case ' ':
            case '\r':
            case '\n':
            case '\t':
                if (s < end) {
                    *s = *fmt;
                }
                s++;
                break;
            case 'i':
                s += json_emit_long(s, end - s, va_arg(ap, long));
                break;
            case 'f':
                s += json_emit_double(s, end - s, va_arg(ap, double));
                break;
            case 'v':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_quoted_str(s, end - s, str, len);
                break;
            case 'V':
                str = va_arg(ap, char *);
                len = va_arg(ap, size_t);
                s += json_emit_unquoted_str(s, end - s, str, len);
                break;
            case 's':
                str = va_arg(ap, char *);
                s += json_emit_quoted_str(s, end - s, str, strlen(str));
                break;
            case 'S':
                str = va_arg(ap, char *);
                s += json_emit_unquoted_str(s, end - s, str, strlen(str));
                break;
            case 'T':
                s += json_emit_unquoted_str(s, end - s, "true", 4);
                break;
            case 'F':
                s += json_emit_unquoted_str(s, end - s, "false", 5);
                break;
            case 'N':
                s += json_emit_unquoted_str(s, end - s, "null", 4);
                break;
            default:
                return 0;
        }
        fmt++;
    }

    /* Best-effort to 0-terminate generated string */
    if (s < end) {
        *s = '\0';
    }

    return s - orig;
}